

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O0

void ecs_delete_table(ecs_world_t *world,ecs_table_t *table)

{
  uint uVar1;
  undefined1 local_30 [4];
  uint32_t id;
  ecs_table_t *local_28;
  ecs_query_t *local_20;
  ecs_table_t *local_18;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  local_30 = (undefined1  [4])0x4;
  local_20 = (ecs_query_t *)0x0;
  local_28 = table;
  local_18 = table;
  table_local = (ecs_table_t *)world;
  ecs_notify_queries(world,(ecs_query_event_t *)local_30);
  uVar1 = local_18->id;
  ecs_table_free((ecs_world_t *)table_local,local_18);
  _ecs_assert(uVar1 != 0,0xc,(char *)0x0,"id != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x44a);
  if (uVar1 != 0) {
    ecs_sparse_remove((ecs_sparse_t *)table_local[0x90].monitors,(ulong)uVar1);
    ecs_sparse_set_generation((ecs_sparse_t *)table_local[0x90].monitors,(ulong)uVar1);
    return;
  }
  __assert_fail("id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x44a,"void ecs_delete_table(ecs_world_t *, ecs_table_t *)");
}

Assistant:

void ecs_delete_table(
    ecs_world_t *world,
    ecs_table_t *table)
{
    /* Notify queries that table is to be removed */
    ecs_notify_queries(
        world, &(ecs_query_event_t){
            .kind = EcsQueryTableUnmatch,
            .table = table
        });

    uint32_t id = table->id;

    /* Free resources associated with table */
    ecs_table_free(world, table);

    /* Remove table from sparse set */
    ecs_assert(id != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_sparse_remove(world->store.tables, id);

    /* Don't do generations as we want table ids to remain 32 bit */
    ecs_sparse_set_generation(world->store.tables, id);
}